

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.cpp
# Opt level: O2

optional_ptr<duckdb::Catalog,_true>
duckdb::Catalog::GetCatalogEntry(CatalogEntryRetriever *retriever,string *catalog_name)

{
  ClientContext *db;
  bool bVar1;
  DatabaseManager *this;
  ClientData *pCVar2;
  AttachedDatabase *pAVar3;
  optional_ptr<duckdb::Catalog,_true> oVar4;
  optional_ptr<duckdb::AttachedDatabase,_true> entry;
  optional_ptr<duckdb::AttachedDatabase,_true> local_28;
  
  db = retriever->context;
  this = DatabaseManager::Get(db);
  bVar1 = ::std::operator==(catalog_name,"temp");
  if (bVar1) {
    pCVar2 = ClientData::Get(db);
    pAVar3 = shared_ptr<duckdb::AttachedDatabase,_true>::operator->(&pCVar2->temporary_objects);
    oVar4.ptr = AttachedDatabase::GetCatalog(pAVar3);
    return (optional_ptr<duckdb::Catalog,_true>)oVar4.ptr;
  }
  bVar1 = ::std::operator==(catalog_name,"system");
  if (bVar1) {
    oVar4.ptr = GetSystemCatalog(db);
    return (optional_ptr<duckdb::Catalog,_true>)oVar4.ptr;
  }
  bVar1 = IsInvalidCatalog(catalog_name);
  if (bVar1) {
    catalog_name = GetDefaultCatalog_abi_cxx11_(retriever);
  }
  local_28 = DatabaseManager::GetDatabase(this,db,catalog_name);
  if (local_28.ptr == (AttachedDatabase *)0x0) {
    oVar4.ptr = (Catalog *)0x0;
  }
  else {
    pAVar3 = optional_ptr<duckdb::AttachedDatabase,_true>::operator->(&local_28);
    oVar4.ptr = AttachedDatabase::GetCatalog(pAVar3);
  }
  return (optional_ptr<duckdb::Catalog,_true>)oVar4.ptr;
}

Assistant:

optional_ptr<Catalog> Catalog::GetCatalogEntry(CatalogEntryRetriever &retriever, const string &catalog_name) {
	auto &context = retriever.GetContext();
	auto &db_manager = DatabaseManager::Get(context);
	if (catalog_name == TEMP_CATALOG) {
		return &ClientData::Get(context).temporary_objects->GetCatalog();
	}
	if (catalog_name == SYSTEM_CATALOG) {
		return &GetSystemCatalog(context);
	}
	auto entry =
	    db_manager.GetDatabase(context, IsInvalidCatalog(catalog_name) ? GetDefaultCatalog(retriever) : catalog_name);
	if (!entry) {
		return nullptr;
	}
	return &entry->GetCatalog();
}